

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_rem_aarch64(floatx80 a,floatx80 b,float_status *status)

{
  long lVar1;
  floatx80 fVar2;
  floatx80 fVar3;
  floatx80 fVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int zExp;
  ushort uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  floatx80 fVar19;
  floatx80 a_00;
  ulong local_48;
  int local_40;
  undefined4 uStack_3c;
  float_status *local_38;
  
  uVar16 = b.low;
  uVar12 = a._8_8_;
  a_00.low = a.low;
  uVar14 = uVar12 & 0xffffffff;
  fVar19._8_8_ = uVar14;
  fVar19.low = a_00.low;
  fVar4._8_8_ = uVar14;
  fVar4.low = a_00.low;
  fVar3._8_8_ = uVar14;
  fVar3.low = a_00.low;
  uVar13 = a.high & 0x7fff;
  if ((long)a_00.low < 0 ||
      ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    uVar11 = b.high & 0x7fff;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 ||
        (long)uVar16 < 0) {
      if (uVar13 != 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar16 == 0) goto LAB_005849f2;
          uVar14 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar16 = uVar16 << ((byte)(uVar14 ^ 0x3f) & 0x3f);
          uVar10 = 1 - (int)(uVar14 ^ 0x3f);
        }
        else {
          uVar10 = (uint)uVar11;
          if (uVar11 == 0x7fff) {
            if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) ==
                (undefined1  [16])0x0) {
              return fVar19;
            }
            goto LAB_00584a6a;
          }
        }
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
          {
            return fVar4;
          }
          if (a_00.low == 0) {
            uVar8 = 0x40;
          }
          else {
            lVar1 = 0x3f;
            if (a_00.low != 0) {
              for (; a_00.low >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar8 = (uint)lVar1 ^ 0x3f;
          }
          a_00.low = a_00.low << ((byte)uVar8 & 0x3f);
          uVar8 = 1 - uVar8;
        }
        else {
          uVar8 = (uint)uVar13;
        }
        iVar15 = uVar8 - uVar10;
        if (iVar15 < 0) {
          if (iVar15 != -1) {
            return fVar3;
          }
          uVar17 = a_00.low >> 1;
          uVar14 = a_00.low << 0x3f;
          iVar15 = 0;
        }
        else {
          uVar14 = 0;
          uVar17 = a_00.low;
        }
        uVar16 = uVar16 | 0x8000000000000000;
        uVar6 = (uint64_t)(uVar16 <= uVar17);
        a_00.low = 0;
        if (uVar16 <= uVar17) {
          a_00.low = uVar16;
        }
        uVar17 = uVar17 - a_00.low;
        zExp = uVar10 + iVar15;
        local_38 = status;
        for (iVar15 = iVar15 + -0x40; uVar10 = (uint)uVar6, 0 < iVar15; iVar15 = iVar15 + -0x3e) {
          uVar5 = estimateDiv128To64(uVar17,uVar14,uVar16);
          uVar6 = 0;
          if (1 < uVar5) {
            uVar6 = uVar5 - 2;
          }
          mul64To128(uVar16,uVar6,(uint64_t *)&local_40,&local_48);
          uVar17 = (ulong)(((int)uVar17 - local_40) - (uint)(uVar14 < local_48)) << 0x3e |
                   uVar14 + -local_48 >> 2;
          uVar14 = -local_48 << 0x3e;
          zExp = zExp + -0x3e;
        }
        if (iVar15 < -0x3f) {
          a_00.low = 0;
        }
        else {
          uVar6 = estimateDiv128To64(uVar17,uVar14,uVar16);
          uVar9 = uVar6 - 2;
          if (uVar6 < 2) {
            uVar9 = 0;
          }
          bVar7 = -(byte)iVar15;
          uVar9 = uVar9 >> (bVar7 & 0x3f);
          mul64To128(uVar16,uVar9 << (bVar7 & 0x3f),(uint64_t *)&local_40,&local_48);
          bVar18 = uVar14 < local_48;
          uVar14 = uVar14 - local_48;
          uVar17 = (uVar17 - CONCAT44(uStack_3c,local_40)) - (ulong)bVar18;
          a_00.low = uVar16 << (bVar7 & 0x3f);
          uVar16 = uVar16 >> ((byte)iVar15 & 0x3f);
          if (iVar15 == 0) {
            uVar16 = 0;
          }
          while( true ) {
            uVar10 = (uint)uVar9;
            if ((uVar17 <= uVar16) && (uVar17 != uVar16 || uVar14 < a_00.low)) break;
            uVar9 = uVar9 + 1;
            bVar18 = uVar14 < a_00.low;
            uVar14 = uVar14 - a_00.low;
            uVar17 = (uVar17 - uVar16) - (ulong)bVar18;
          }
        }
        uVar9 = a_00.low - uVar14;
        uVar16 = (uVar16 - uVar17) - (ulong)(a_00.low < uVar14);
        bVar7 = (byte)((uVar12 & 0xffff) >> 0xf);
        if (((uVar16 < uVar17) || (uVar9 < uVar14 && uVar16 == uVar17)) ||
           (((uVar9 == uVar14 && (uVar16 == uVar17)) && ((uVar10 & 1) != 0)))) {
          bVar7 = bVar7 ^ 1;
          uVar14 = uVar9;
          uVar17 = uVar16;
        }
        fVar19 = normalizeRoundAndPackFloatx80_aarch64('P',bVar7,zExp,uVar17,uVar14,local_38);
        return fVar19;
      }
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
          uVar11 == 0x7fff)) {
LAB_00584a6a:
        a_00._8_8_ = uVar12 & 0xffffffff;
        fVar19 = propagateFloatx80NaN_aarch64(a_00,b,status);
        return fVar19;
      }
    }
  }
LAB_005849f2:
  status->float_exception_flags = status->float_exception_flags | 1;
  fVar2._10_6_ = (int6)(uVar14 >> 0x10);
  fVar2.high = 0xffff;
  fVar2.low = 0xc000000000000000;
  return fVar2;
}

Assistant:

floatx80 floatx80_rem(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t q, term0, term1, alternateASig0, alternateASig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig0<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( (uint64_t) ( aSig0<<1 ) == 0 ) return a;
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        shift128Right( aSig0, 0, 1, &aSig0, &aSig1 );
        expDiff = 0;
    }
    q = ( bSig <= aSig0 );
    if ( q ) aSig0 -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        mul64To128( bSig, q, &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( aSig0, aSig1, 62, &aSig0, &aSig1 );
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        mul64To128( bSig, q<<( 64 - expDiff ), &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( 0, bSig, 64 - expDiff, &term0, &term1 );
        while ( le128( term0, term1, aSig0, aSig1 ) ) {
            ++q;
            sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        }
    }
    else {
        term1 = 0;
        term0 = bSig;
    }
    sub128( term0, term1, aSig0, aSig1, &alternateASig0, &alternateASig1 );
    if (    lt128( alternateASig0, alternateASig1, aSig0, aSig1 )
         || (    eq128( alternateASig0, alternateASig1, aSig0, aSig1 )
              && ( q & 1 ) )
       ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
        zSign = ! zSign;
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);

}